

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPInform.cpp
# Opt level: O2

snmp_request_id_t
queue_and_send_trap(list<InformItem_*,_std::allocator<InformItem_*>_> *informList,SNMPTrap *trap,
                   IPAddress *ip,bool replaceQueuedRequests,int retries,int delay_ms)

{
  bool bVar1;
  snmp_request_id_t sVar2;
  InformItem *item;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  bVar1 = SNMPTrap::buildForSending(trap);
  if (bVar1) {
    if (replaceQueuedRequests) {
      local_50._8_8_ = 0;
      local_38 = std::
                 _Function_handler<bool_(InformItem_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/src/SNMPInform.cpp:36:45)>
                 ::_M_invoke;
      local_40 = std::
                 _Function_handler<bool_(InformItem_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/src/SNMPInform.cpp:36:45)>
                 ::_M_manager;
      local_50._M_unused._M_object = trap;
      remove_inform_from_list(informList,(function<bool_(InformItem_*)> *)&local_50);
      std::_Function_base::~_Function_base((_Function_base *)&local_50);
    }
    bVar1 = trap->inform == true;
    if (bVar1) {
      item = (InformItem *)calloc(1,0x48);
      item->delay_ms = (long)delay_ms;
      item->requestID = (trap->super_SNMPPacket).requestID;
      item->retries = retries;
      (item->ip)._address = ip->_address;
      item->trap = trap;
      std::__cxx11::list<InformItem_*,_std::allocator<InformItem_*>_>::push_back(informList,&item);
    }
    SNMPTrap::sendTo(trap,ip,bVar1);
    sVar2 = (trap->super_SNMPPacket).requestID;
  }
  else {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

snmp_request_id_t
queue_and_send_trap(std::list<struct InformItem *> &informList, SNMPTrap *trap, const IPAddress& ip, bool replaceQueuedRequests,
                    int retries, int delay_ms) {
    bool buildStatus = trap->buildForSending();
    if(!buildStatus) {
        SNMP_LOGW("Couldn't build trap\n");
        return INVALID_SNMP_REQUEST_ID;
    };
    SNMP_LOGD("%lu informs in informList", informList.size());
    //TODO: could be race condition here, buildStatus to return packet?
    if(replaceQueuedRequests){
        SNMP_LOGD("Removing any outstanding informs for this trap\n");
        remove_inform_from_list(informList, [trap](struct InformItem* informItem) -> bool {
            return informItem->trap == trap;
        });
    }

    if(trap->inform){
        struct InformItem* item = (struct InformItem*)calloc(1, sizeof(struct InformItem));
        item->delay_ms = delay_ms;
        item->received = false;
        item->requestID = trap->requestID;
        item->retries = retries;
        item->ip = ip;
        item->lastSent = millis();
        item->trap = trap;
        item->missed = false;

        SNMP_LOGD("Adding Inform request to queue: %lu\n", item->requestID);

        informList.push_back(item);

        trap->sendTo(ip, true);
    } else {
        // normal send
        SNMP_LOGD("Sending normal trap\n");
        trap->sendTo(ip);
    }

    return trap->requestID;
}